

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

bool __thiscall ON_PostEffect::GetAllParameters(ON_PostEffect *this,ON_PostEffectParams *params)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  bool bVar3;
  ON_PostEffectParams local_20;
  
  pOVar2 = CImpl::PepNode(this->_impl);
  if (pOVar2 == (ON_XMLNode *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x25])(pOVar2,L"state");
    bVar3 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1) != (ON_XMLNode *)0x0;
    if (bVar3) {
      ON_PostEffectParams::ON_PostEffectParams(&local_20,(ON_XMLNode *)CONCAT44(extraout_var,iVar1))
      ;
      ON_XMLNode::operator=(&params->_impl->_node,&(local_20._impl)->_node);
      ON_PostEffectParams::~ON_PostEffectParams(&local_20);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool ON_PostEffect::GetAllParameters(ON_PostEffectParams& params) const
{
  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr == pep_node)
    return false;

  const ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
  if (nullptr == pep_param_node)
    return false;

  params = ON_PostEffectParams(*pep_param_node);

  return true;
}